

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warnings.cpp
# Opt level: O1

bool __thiscall node::Warnings::Set(Warnings *this,warning_type id,bilingual_str message)

{
  bilingual_str *in_RDX;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>,_bool>
  pVar1;
  variant<kernel::Warning,_node::Warning> local_80;
  unique_lock<std::mutex> local_78;
  pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str> local_68;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._M_owns = false;
  local_78._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_78);
  std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>::
  pair<std::variant<kernel::Warning,_node::Warning>_&,_bilingual_str,_true>
            (&local_68,&local_80,in_RDX);
  pVar1 = std::
          _Rb_tree<std::variant<kernel::Warning,node::Warning>,std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>,std::_Select1st<std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>>,std::less<std::variant<kernel::Warning,node::Warning>>,std::allocator<std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>>>
          ::
          _M_insert_unique<std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>>
                    ((_Rb_tree<std::variant<kernel::Warning,node::Warning>,std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>,std::_Select1st<std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>>,std::less<std::variant<kernel::Warning,node::Warning>>,std::allocator<std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>>>
                      *)&this->m_warnings,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.second.translated._M_dataplus._M_p != &local_68.second.translated.field_2) {
    operator_delete(local_68.second.translated._M_dataplus._M_p,
                    local_68.second.translated.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.second.original._M_dataplus._M_p != &local_68.second.original.field_2) {
    operator_delete(local_68.second.original._M_dataplus._M_p,
                    local_68.second.original.field_2._M_allocated_capacity + 1);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_78);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    CClientUIInterface::NotifyAlertChanged((CClientUIInterface *)&uiInterface);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (bool)(pVar1.second & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool Warnings::Set(warning_type id, bilingual_str message)
{
    const auto& [_, inserted]{WITH_LOCK(m_mutex, return m_warnings.insert({id, std::move(message)}))};
    if (inserted) uiInterface.NotifyAlertChanged();
    return inserted;
}